

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

void js_free_modules(JSContext *ctx,JSFreeModuleEnum flag)

{
  char cVar1;
  list_head *plVar2;
  list_head *plVar3;
  
  plVar2 = (ctx->loaded_modules).next;
joined_r0x001196a4:
  plVar3 = plVar2;
  if (plVar3 == &ctx->loaded_modules) {
    return;
  }
  plVar2 = plVar3->next;
  if (flag != JS_FREE_MODULE_ALL) {
    if (flag != JS_FREE_MODULE_NOT_EVALUATED) goto code_r0x001196bc;
    cVar1 = *(char *)((long)&plVar3[7].next + 3);
    goto joined_r0x001196cd;
  }
  goto LAB_001196cf;
code_r0x001196bc:
  if (flag == JS_FREE_MODULE_NOT_RESOLVED) {
    cVar1 = *(char *)&plVar3[7].next;
joined_r0x001196cd:
    if (cVar1 == '\0') {
LAB_001196cf:
      js_free_module_def(ctx,(JSModuleDef *)&plVar3[-1].next);
    }
  }
  goto joined_r0x001196a4;
}

Assistant:

static void js_free_modules(JSContext *ctx, JSFreeModuleEnum flag)
{
    struct list_head *el, *el1;
    list_for_each_safe(el, el1, &ctx->loaded_modules) {
        JSModuleDef *m = list_entry(el, JSModuleDef, link);
        if (flag == JS_FREE_MODULE_ALL ||
            (flag == JS_FREE_MODULE_NOT_RESOLVED && !m->resolved) ||
            (flag == JS_FREE_MODULE_NOT_EVALUATED && !m->evaluated)) {
            js_free_module_def(ctx, m);
        }
    }
}